

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_console.cpp
# Opt level: O0

bool __thiscall
CNetConsole::Open(CNetConsole *this,NETADDR BindAddr,CNetBan *pNetBan,NETFUNC_NEWCLIENT pfnNewClient
                 ,NETFUNC_DELCLIENT pfnDelClient,void *pUser)

{
  long lVar1;
  NETSOCKET sock;
  NETADDR bindaddr;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  int *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  NETSOCKET NVar3;
  int i;
  undefined8 in_stack_ffffffffffffff18;
  void *in_stack_ffffffffffffff20;
  CConsoleNetConnection *this_00;
  int in_stack_ffffffffffffff34;
  undefined1 *puVar4;
  int local_b4;
  bool local_81;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 local_48;
  int local_40;
  
  puVar4 = &stack0x00000008;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mem_zero(in_stack_ffffffffffffff20,(uint)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  *in_RDI = 0;
  in_RDI[1] = -1;
  in_RDI[2] = -1;
  *(undefined8 *)(in_RDI + 4) = in_RSI;
  this_00 = *(CConsoleNetConnection **)(puVar4 + 8);
  bindaddr.ip[0] = (char)in_stack_ffffffffffffffa4;
  bindaddr.ip[1] = (char)((uint)in_stack_ffffffffffffffa4 >> 8);
  bindaddr.ip[2] = (char)((uint)in_stack_ffffffffffffffa4 >> 0x10);
  bindaddr.ip[3] = (char)((uint)in_stack_ffffffffffffffa4 >> 0x18);
  bindaddr.type = in_stack_ffffffffffffffa0;
  bindaddr.ip[4] = (char)in_stack_ffffffffffffffa8;
  bindaddr.ip[5] = (char)((uint)in_stack_ffffffffffffffa8 >> 8);
  bindaddr.ip[6] = (char)((uint)in_stack_ffffffffffffffa8 >> 0x10);
  bindaddr.ip[7] = (char)((uint)in_stack_ffffffffffffffa8 >> 0x18);
  bindaddr.ip[8] = (char)in_stack_ffffffffffffffac;
  bindaddr.ip[9] = (char)((ulong)in_stack_ffffffffffffffac >> 8);
  bindaddr.ip[10] = (char)((ulong)in_stack_ffffffffffffffac >> 0x10);
  bindaddr.ip[0xb] = (char)((ulong)in_stack_ffffffffffffffac >> 0x18);
  bindaddr.ip[0xc] = (char)((ulong)in_stack_ffffffffffffffac >> 0x20);
  bindaddr.ip[0xd] = (char)((ulong)in_stack_ffffffffffffffac >> 0x28);
  bindaddr.ip[0xe] = (char)((ulong)in_stack_ffffffffffffffac >> 0x30);
  bindaddr.ip[0xf] = (char)((ulong)in_stack_ffffffffffffffac >> 0x38);
  bindaddr.port = (short)in_stack_ffffffffffffffb4;
  bindaddr.reserved = (short)((uint)in_stack_ffffffffffffffb4 >> 0x10);
  NVar3 = net_tcp_create(bindaddr);
  local_48 = NVar3._0_8_;
  local_40 = NVar3.ipv6sock;
  *(undefined8 *)in_RDI = local_48;
  in_RDI[2] = local_40;
  if (*in_RDI == 0) {
    local_81 = false;
  }
  else {
    NVar3._4_8_ = puVar4;
    NVar3.type = in_stack_ffffffffffffff34;
    iVar2 = net_tcp_listen(NVar3,(int)this_00);
    if (iVar2 == 0) {
      sock._4_8_ = puVar4;
      sock.type = in_stack_ffffffffffffff34;
      net_set_non_blocking(sock);
      for (local_b4 = 0; local_b4 < 4; local_b4 = local_b4 + 1) {
        CConsoleNetConnection::Reset(this_00);
      }
      *(undefined8 *)(in_RDI + 0x6ae) = in_RDX;
      *(undefined8 *)(in_RDI + 0x6b0) = in_RCX;
      *(undefined8 *)(in_RDI + 0x6b2) = in_R8;
      local_81 = true;
    }
    else {
      local_81 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_81;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetConsole::Open(NETADDR BindAddr, CNetBan *pNetBan, NETFUNC_NEWCLIENT pfnNewClient, NETFUNC_DELCLIENT pfnDelClient, void *pUser)
{
	// zero out the whole structure
	mem_zero(this, sizeof(*this));
	m_Socket.type = NETTYPE_INVALID;
	m_Socket.ipv4sock = -1;
	m_Socket.ipv6sock = -1;
	m_pNetBan = pNetBan;

	// open socket
	m_Socket = net_tcp_create(BindAddr);
	if(!m_Socket.type)
		return false;
	if(net_tcp_listen(m_Socket, NET_MAX_CONSOLE_CLIENTS))
		return false;
	net_set_non_blocking(m_Socket);

	for(int i = 0; i < NET_MAX_CONSOLE_CLIENTS; i++)
		m_aSlots[i].m_Connection.Reset();

	m_pfnNewClient = pfnNewClient;
	m_pfnDelClient = pfnDelClient;
	m_UserPtr = pUser;

	return true;
}